

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O2

void applycalcrule_stepped(profile_rec_new *profile,LossRec *x,int layer,bool isLast)

{
  OASIS_FLOAT OVar1;
  uchar uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  pointer ptVar5;
  char cVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  OASIS_FLOAT OVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar21;
  char cVar31;
  undefined1 auVar22 [12];
  char cVar29;
  char cVar30;
  uint uVar32;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined2 uVar33;
  float fVar35;
  undefined1 auVar39 [12];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar40 [12];
  undefined2 uVar57;
  undefined1 auVar41 [12];
  undefined1 auVar53 [16];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar56 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  OASIS_FLOAT OVar81;
  float fVar82;
  OASIS_FLOAT OVar83;
  undefined1 auVar84 [12];
  undefined1 in_XMM7 [16];
  undefined1 auVar87 [16];
  undefined1 auVar85 [12];
  undefined1 auVar89 [16];
  undefined1 auVar90 [12];
  undefined1 in_XMM9 [16];
  undefined1 auVar93 [16];
  undefined1 auVar91 [12];
  undefined1 auVar95 [16];
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 auVar24 [16];
  undefined4 uVar34;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar44 [14];
  undefined1 auVar49 [16];
  undefined1 auVar45 [14];
  undefined1 auVar52 [16];
  undefined1 auVar46 [14];
  undefined1 auVar55 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar66 [16];
  undefined1 auVar71 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar63 [16];
  undefined1 auVar68 [16];
  undefined1 auVar73 [16];
  undefined1 auVar64 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  
  uVar7 = profile->calcrule_id;
  switch(uVar7) {
  case 0xc:
    fVar11 = x->loss;
    if (fVar11 <= 0.0) {
      return;
    }
    ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      if (ptVar5 == (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      if (ptVar5->tc_id == '\0') break;
      ptVar5 = ptVar5 + 1;
    }
    fVar21 = fVar11 - ptVar5->tc_val;
    fVar35 = 0.0;
    if (0.0 <= fVar21) {
      fVar35 = fVar21;
    }
    fVar21 = x->effective_deductible + (fVar11 - fVar35);
    x->effective_deductible = fVar21;
    if (x->under_limit <= fVar21 && fVar21 != x->under_limit) {
      x->under_limit = fVar21;
    }
    x->retained_loss = (fVar11 - fVar35) + x->retained_loss;
    goto LAB_0010b9d4;
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x21:
  case 0x23:
  case 0x24:
switchD_0010af93_caseD_d:
    fprintf(_stderr,"FATAL: Unknown calc rule %d\n",(ulong)uVar7);
    return;
  case 0xe:
    OVar13 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      if (ptVar5->tc_id == '\x04') {
        OVar13 = ptVar5->tc_val;
      }
    }
    fVar9 = x->loss;
    fVar21 = fVar9;
    if (OVar13 < fVar9) {
      x->over_limit = fVar9 - OVar13;
      fVar21 = OVar13;
    }
    fVar11 = x->effective_deductible;
    if (x->effective_deductible <= x->under_limit) {
      fVar11 = x->under_limit;
    }
    fVar8 = OVar13 - fVar21;
    if (fVar11 <= OVar13 - fVar21) {
      fVar8 = fVar11;
    }
    x->under_limit = fVar8;
    if (1 < layer) goto LAB_0010b361;
LAB_0010b723:
    OVar13 = (fVar9 - fVar21) + x->retained_loss;
    goto LAB_0010b72c;
  case 0x1b:
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar12 = 0.0;
    fVar35 = 0.0;
    fVar82 = 0.0;
    fVar11 = 0.0;
    fVar21 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar53._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar53[3] = uVar18;
      auVar53[2] = uVar18;
      auVar53[0] = (undefined1)uVar34;
      auVar53[1] = auVar53[0];
      auVar53._8_8_ = 0;
      auVar23 = pshuflw(auVar53,auVar53,0);
      uVar33 = CONCAT11(-(auVar23[0] == '\x0e'),-(auVar23[0] == '\x0e'));
      uVar34 = CONCAT13(-(auVar23[1] == '\r'),CONCAT12(-(auVar23[1] == '\r'),uVar33));
      uVar36 = CONCAT15(-(auVar23[2] == '\v'),CONCAT14(-(auVar23[2] == '\v'),uVar34));
      uVar37 = CONCAT17(-(auVar23[3] == '\n'),CONCAT16(-(auVar23[3] == '\n'),uVar36));
      auVar42._0_10_ = CONCAT19(-(auVar23[4] == '\t'),CONCAT18(-(auVar23[4] == '\t'),uVar37));
      auVar42[10] = -(auVar23[5] == '\0');
      auVar42[0xb] = -(auVar23[5] == '\0');
      auVar46[0xc] = -(auVar23[6] == '\x05');
      auVar46._0_12_ = auVar42;
      auVar46[0xd] = -(auVar23[6] == '\x05');
      auVar54[0xe] = -(auVar23[7] == '\x04');
      auVar54._0_14_ = auVar46;
      auVar54[0xf] = -(auVar23[7] == '\x04');
      uVar57 = (undefined2)((ulong)uVar37 >> 0x30);
      auVar74._12_2_ = uVar57;
      auVar74._0_12_ = auVar42;
      auVar74._14_2_ = uVar57;
      uVar57 = (undefined2)((uint6)uVar36 >> 0x20);
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._10_2_ = uVar57;
      auVar73._0_10_ = auVar42._0_10_;
      auVar72._10_6_ = auVar73._10_6_;
      auVar72._8_2_ = uVar57;
      auVar72._0_8_ = uVar37;
      uVar57 = (undefined2)((uint)uVar34 >> 0x10);
      auVar71._8_8_ = auVar72._8_8_;
      auVar71._6_2_ = uVar57;
      auVar71._0_6_ = uVar36;
      auVar70._6_10_ = auVar71._6_10_;
      auVar70._4_2_ = uVar57;
      auVar70._0_4_ = uVar34;
      uVar57 = (undefined2)((unkuint10)auVar42._0_10_ >> 0x40);
      uVar7 = CONCAT22(uVar57,uVar57);
      auVar43._0_8_ = CONCAT26(auVar42._10_2_,CONCAT24(auVar42._10_2_,uVar7));
      auVar43._8_2_ = auVar46._12_2_;
      auVar43._10_2_ = auVar46._12_2_;
      auVar55._14_2_ = auVar54._14_2_;
      auVar55._12_2_ = auVar55._14_2_;
      auVar55._0_12_ = auVar43;
      OVar13 = ptVar5->tc_val;
      uVar32 = (uint)((ulong)auVar43._0_8_ >> 0x20);
      fVar35 = (float)(~uVar7 & (uint)fVar35 | (uint)OVar13 & uVar7);
      fVar82 = (float)(~uVar32 & (uint)fVar82 | (uint)OVar13 & uVar32);
      fVar11 = (float)(~auVar43._8_4_ & (uint)fVar11 | (uint)OVar13 & auVar43._8_4_);
      fVar21 = (float)(~auVar55._12_4_ & (uint)fVar21 | (uint)OVar13 & auVar55._12_4_);
      fVar8 = (float)(~CONCAT22(uVar33,uVar33) & (uint)fVar8 |
                     (uint)OVar13 & CONCAT22(uVar33,uVar33));
      fVar10 = (float)(~auVar70._4_4_ & (uint)fVar10 | (uint)OVar13 & auVar70._4_4_);
      fVar9 = (float)(~auVar72._8_4_ & (uint)fVar9 | (uint)OVar13 & auVar72._8_4_);
      fVar12 = (float)(~auVar73._12_4_ & (uint)fVar12 | (uint)OVar13 & auVar73._12_4_);
    }
    fVar59 = x->loss / x->accumulated_tiv;
    if ((((fVar12 == 1.0) && (!NAN(fVar12))) || (fVar58 = 0.0, fVar59 < fVar12)) &&
       (fVar58 = 0.0, fVar35 <= fVar59)) {
      fVar82 = fVar9 * x->accumulated_tiv - fVar82;
      fVar9 = 0.0;
      if (0.0 <= fVar82) {
        fVar9 = fVar82;
      }
      if (fVar9 <= fVar21) {
        fVar21 = fVar9;
      }
      if (fVar8 * fVar21 <= fVar11) {
        fVar11 = fVar8 * fVar21;
      }
      fVar58 = (fVar10 + 1.0) * (fVar11 + fVar21);
    }
    if (profile->step_id != 1) {
      fVar58 = fVar58 + x->step_loss;
    }
    x->step_loss = fVar58;
    if (!isLast) {
      return;
    }
    x->loss = fVar58;
    return;
  case 0x1c:
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar12 = 0.0;
    fVar11 = 0.0;
    OVar13 = 0.0;
    fVar35 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar83 = ptVar5->tc_val;
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      cVar6 = (char)uVar34;
      OVar1 = OVar83;
      if (cVar6 != '\0') {
        OVar1 = fVar35;
      }
      fVar35 = OVar1;
      OVar1 = OVar83;
      if (cVar6 != '\t') {
        OVar1 = OVar13;
      }
      OVar13 = OVar1;
      OVar1 = OVar83;
      if (cVar6 != '\x05') {
        OVar1 = fVar11;
      }
      fVar11 = OVar1;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar16._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar16[3] = uVar18;
      auVar16[2] = uVar18;
      auVar16[1] = cVar6;
      auVar16[0] = cVar6;
      auVar16._8_8_ = 0;
      auVar23 = pshuflw(in_XMM7,auVar16,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\n'),
                       CONCAT12(-(cVar6 == '\n'),CONCAT11(-(cVar6 == '\n'),-(cVar6 == '\n'))));
      auVar84._0_8_ =
           CONCAT17(-(cVar29 == '\v'),
                    CONCAT16(-(cVar29 == '\v'),
                             CONCAT15(-(cVar29 == '\v'),CONCAT14(-(cVar29 == '\v'),uVar7))));
      auVar84[8] = -(cVar30 == '\r');
      auVar84[9] = -(cVar30 == '\r');
      auVar84[10] = -(cVar30 == '\r');
      auVar84[0xb] = -(cVar30 == '\r');
      auVar86[0xc] = -(cVar31 == '\x0e');
      auVar86._0_12_ = auVar84;
      auVar86[0xd] = -(cVar31 == '\x0e');
      auVar86[0xe] = -(cVar31 == '\x0e');
      auVar86[0xf] = -(cVar31 == '\x0e');
      uVar32 = (uint)((ulong)auVar84._0_8_ >> 0x20);
      auVar87._0_4_ = ~uVar7 & (uint)fVar8;
      auVar87._4_4_ = ~uVar32 & (uint)fVar10;
      auVar87._8_4_ = ~auVar84._8_4_ & (uint)fVar9;
      auVar87._12_4_ = ~auVar86._12_4_ & (uint)fVar12;
      auVar3._4_4_ = (uint)OVar83 & uVar32;
      auVar3._0_4_ = (uint)OVar83 & uVar7;
      auVar3._8_4_ = (uint)OVar83 & auVar84._8_4_;
      auVar3._12_4_ = (uint)OVar83 & auVar86._12_4_;
      in_XMM7 = auVar87 | auVar3;
      fVar8 = in_XMM7._0_4_;
      fVar10 = in_XMM7._4_4_;
      fVar9 = in_XMM7._8_4_;
      fVar12 = in_XMM7._12_4_;
    }
    fVar82 = x->loss / x->accumulated_tiv;
    if ((((fVar8 == 1.0) && (!NAN(fVar8))) || (fVar21 = 0.0, fVar82 < fVar8)) &&
       (fVar21 = 0.0, OVar13 <= fVar82)) {
      fVar35 = fVar10 * x->loss - fVar35;
      fVar21 = 0.0;
      if (0.0 <= fVar35) {
        fVar21 = fVar35;
      }
      if (fVar12 * fVar21 <= fVar11) {
        fVar11 = fVar12 * fVar21;
      }
      fVar21 = (fVar9 + 1.0) * (fVar11 + fVar21);
    }
    break;
  case 0x1d:
    fVar11 = 0.0;
    fVar21 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    OVar13 = 0.0;
    OVar83 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar1 = ptVar5->tc_val;
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      cVar6 = (char)uVar34;
      OVar81 = OVar1;
      if (cVar6 != '\r') {
        OVar81 = OVar83;
      }
      OVar83 = OVar1;
      if (cVar6 != '\x0e') {
        OVar83 = fVar9;
      }
      fVar9 = OVar83;
      OVar83 = OVar1;
      if (cVar6 != '\x05') {
        OVar83 = OVar13;
      }
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar15._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar15[3] = uVar18;
      auVar15[2] = uVar18;
      auVar15[1] = cVar6;
      auVar15[0] = cVar6;
      auVar15._8_8_ = 0;
      auVar23 = pshuflw(in_XMM9,auVar15,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\0'),
                       CONCAT12(-(cVar6 == '\0'),CONCAT11(-(cVar6 == '\0'),-(cVar6 == '\0'))));
      auVar91._0_8_ =
           CONCAT17(-(cVar29 == '\t'),
                    CONCAT16(-(cVar29 == '\t'),
                             CONCAT15(-(cVar29 == '\t'),CONCAT14(-(cVar29 == '\t'),uVar7))));
      auVar91[8] = -(cVar30 == '\n');
      auVar91[9] = -(cVar30 == '\n');
      auVar91[10] = -(cVar30 == '\n');
      auVar91[0xb] = -(cVar30 == '\n');
      auVar94[0xc] = -(cVar31 == '\v');
      auVar94._0_12_ = auVar91;
      auVar94[0xd] = -(cVar31 == '\v');
      auVar94[0xe] = -(cVar31 == '\v');
      auVar94[0xf] = -(cVar31 == '\v');
      auVar78._0_4_ = (uint)OVar1 & uVar7;
      uVar32 = (uint)((ulong)auVar91._0_8_ >> 0x20);
      auVar78._4_4_ = (uint)OVar1 & uVar32;
      auVar78._8_4_ = (uint)OVar1 & auVar91._8_4_;
      auVar78._12_4_ = (uint)OVar1 & auVar94._12_4_;
      auVar95._0_4_ = ~uVar7 & (uint)fVar11;
      auVar95._4_4_ = ~uVar32 & (uint)fVar21;
      auVar95._8_4_ = ~auVar91._8_4_ & (uint)fVar8;
      auVar95._12_4_ = ~auVar94._12_4_ & (uint)fVar10;
      in_XMM9 = auVar95 | auVar78;
      fVar11 = in_XMM9._0_4_;
      fVar21 = in_XMM9._4_4_;
      fVar8 = in_XMM9._8_4_;
      fVar10 = in_XMM9._12_4_;
      OVar13 = OVar83;
      OVar83 = OVar81;
    }
    fVar12 = x->loss / x->accumulated_tiv;
    if ((((fVar8 != 1.0) || (NAN(fVar8))) && (fVar35 = 0.0, fVar8 <= fVar12)) ||
       (fVar35 = 0.0, fVar12 < fVar21)) goto LAB_0010b873;
    fVar10 = fVar10 * x->accumulated_tiv;
    goto LAB_0010b84d;
  case 0x1e:
    fVar12 = 0.0;
    fVar35 = 0.0;
    fVar82 = 0.0;
    fVar59 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar11 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar47._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar47[3] = uVar18;
      auVar47[2] = uVar18;
      auVar47[0] = (undefined1)uVar34;
      auVar47[1] = auVar47[0];
      auVar47._8_8_ = 0;
      auVar23 = pshuflw(auVar47,auVar47,0);
      uVar33 = CONCAT11(-(auVar23[0] == '\0'),-(auVar23[0] == '\0'));
      uVar34 = CONCAT13(-(auVar23[1] == '\t'),CONCAT12(-(auVar23[1] == '\t'),uVar33));
      uVar36 = CONCAT15(-(auVar23[2] == '\n'),CONCAT14(-(auVar23[2] == '\n'),uVar34));
      uVar37 = CONCAT17(-(auVar23[3] == '\v'),CONCAT16(-(auVar23[3] == '\v'),uVar36));
      auVar38._0_10_ = CONCAT19(-(auVar23[4] == '\r'),CONCAT18(-(auVar23[4] == '\r'),uVar37));
      auVar38[10] = -(auVar23[5] == '\x0e');
      auVar38[0xb] = -(auVar23[5] == '\x0e');
      auVar44[0xc] = -(auVar23[6] == '\x04');
      auVar44._0_12_ = auVar38;
      auVar44[0xd] = -(auVar23[6] == '\x04');
      auVar48[0xe] = -(auVar23[7] == '\x05');
      auVar48._0_14_ = auVar44;
      auVar48[0xf] = -(auVar23[7] == '\x05');
      uVar57 = (undefined2)((ulong)uVar37 >> 0x30);
      auVar64._12_2_ = uVar57;
      auVar64._0_12_ = auVar38;
      auVar64._14_2_ = uVar57;
      uVar57 = (undefined2)((uint6)uVar36 >> 0x20);
      auVar63._12_4_ = auVar64._12_4_;
      auVar63._10_2_ = uVar57;
      auVar63._0_10_ = auVar38._0_10_;
      auVar62._10_6_ = auVar63._10_6_;
      auVar62._8_2_ = uVar57;
      auVar62._0_8_ = uVar37;
      uVar57 = (undefined2)((uint)uVar34 >> 0x10);
      auVar61._8_8_ = auVar62._8_8_;
      auVar61._6_2_ = uVar57;
      auVar61._0_6_ = uVar36;
      auVar60._6_10_ = auVar61._6_10_;
      auVar60._4_2_ = uVar57;
      auVar60._0_4_ = uVar34;
      uVar57 = (undefined2)((unkuint10)auVar38._0_10_ >> 0x40);
      uVar7 = CONCAT22(uVar57,uVar57);
      auVar39._0_8_ = CONCAT26(auVar38._10_2_,CONCAT24(auVar38._10_2_,uVar7));
      auVar39._8_2_ = auVar44._12_2_;
      auVar39._10_2_ = auVar44._12_2_;
      auVar49._14_2_ = auVar48._14_2_;
      auVar49._12_2_ = auVar49._14_2_;
      auVar49._0_12_ = auVar39;
      OVar13 = ptVar5->tc_val;
      uVar32 = (uint)((ulong)auVar39._0_8_ >> 0x20);
      fVar8 = (float)(~uVar7 & (uint)fVar8 | (uint)OVar13 & uVar7);
      fVar10 = (float)(~uVar32 & (uint)fVar10 | (uint)OVar13 & uVar32);
      fVar9 = (float)(~auVar39._8_4_ & (uint)fVar9 | (uint)OVar13 & auVar39._8_4_);
      fVar11 = (float)(~auVar49._12_4_ & (uint)fVar11 | (uint)OVar13 & auVar49._12_4_);
      fVar12 = (float)(~CONCAT22(uVar33,uVar33) & (uint)fVar12 |
                      (uint)OVar13 & CONCAT22(uVar33,uVar33));
      fVar35 = (float)(~auVar60._4_4_ & (uint)fVar35 | (uint)OVar13 & auVar60._4_4_);
      fVar82 = (float)(~auVar62._8_4_ & (uint)fVar82 | (uint)OVar13 & auVar62._8_4_);
      fVar59 = (float)(~auVar63._12_4_ & (uint)fVar59 | (uint)OVar13 & auVar63._12_4_);
    }
    fVar58 = x->loss / x->accumulated_tiv;
    if ((((fVar82 == 1.0) && (!NAN(fVar82))) || (fVar21 = 0.0, fVar58 < fVar82)) &&
       (fVar21 = 0.0, fVar35 <= fVar58)) {
      fVar12 = fVar9 * fVar59 - fVar12;
      fVar21 = 0.0;
      if (0.0 <= fVar12) {
        fVar21 = fVar12;
      }
      if (fVar10 * fVar21 <= fVar11) {
        fVar11 = fVar10 * fVar21;
      }
      fVar11 = fVar11 + fVar21;
LAB_0010b81d:
      fVar21 = (fVar8 + 1.0) * fVar11;
    }
    break;
  case 0x1f:
    fVar11 = 0.0;
    fVar21 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    OVar13 = 0.0;
    OVar83 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar1 = ptVar5->tc_val;
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      cVar6 = (char)uVar34;
      OVar81 = OVar1;
      if (cVar6 != '\r') {
        OVar81 = OVar83;
      }
      OVar83 = OVar1;
      if (cVar6 != '\x0e') {
        OVar83 = fVar9;
      }
      fVar9 = OVar83;
      OVar83 = OVar1;
      if (cVar6 != '\x05') {
        OVar83 = OVar13;
      }
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar14._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar14[3] = uVar18;
      auVar14[2] = uVar18;
      auVar14[1] = cVar6;
      auVar14[0] = cVar6;
      auVar14._8_8_ = 0;
      auVar23 = pshuflw(in_XMM9,auVar14,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\0'),
                       CONCAT12(-(cVar6 == '\0'),CONCAT11(-(cVar6 == '\0'),-(cVar6 == '\0'))));
      auVar90._0_8_ =
           CONCAT17(-(cVar29 == '\t'),
                    CONCAT16(-(cVar29 == '\t'),
                             CONCAT15(-(cVar29 == '\t'),CONCAT14(-(cVar29 == '\t'),uVar7))));
      auVar90[8] = -(cVar30 == '\n');
      auVar90[9] = -(cVar30 == '\n');
      auVar90[10] = -(cVar30 == '\n');
      auVar90[0xb] = -(cVar30 == '\n');
      auVar92[0xc] = -(cVar31 == '\v');
      auVar92._0_12_ = auVar90;
      auVar92[0xd] = -(cVar31 == '\v');
      auVar92[0xe] = -(cVar31 == '\v');
      auVar92[0xf] = -(cVar31 == '\v');
      auVar77._0_4_ = (uint)OVar1 & uVar7;
      uVar32 = (uint)((ulong)auVar90._0_8_ >> 0x20);
      auVar77._4_4_ = (uint)OVar1 & uVar32;
      auVar77._8_4_ = (uint)OVar1 & auVar90._8_4_;
      auVar77._12_4_ = (uint)OVar1 & auVar92._12_4_;
      auVar93._0_4_ = ~uVar7 & (uint)fVar11;
      auVar93._4_4_ = ~uVar32 & (uint)fVar21;
      auVar93._8_4_ = ~auVar90._8_4_ & (uint)fVar8;
      auVar93._12_4_ = ~auVar92._12_4_ & (uint)fVar10;
      in_XMM9 = auVar93 | auVar77;
      fVar11 = in_XMM9._0_4_;
      fVar21 = in_XMM9._4_4_;
      fVar8 = in_XMM9._8_4_;
      fVar10 = in_XMM9._12_4_;
      OVar13 = OVar83;
      OVar83 = OVar81;
    }
    fVar12 = x->loss / x->accumulated_tiv;
    if ((((fVar8 != 1.0) || (NAN(fVar8))) && (fVar35 = 0.0, fVar8 <= fVar12)) ||
       (fVar35 = 0.0, fVar12 < fVar21)) goto LAB_0010b873;
LAB_0010b84d:
    fVar21 = 0.0;
    if (0.0 <= fVar10 - fVar11) {
      fVar21 = fVar10 - fVar11;
    }
    if (fVar9 * fVar21 <= OVar13) {
      OVar13 = fVar9 * fVar21;
    }
    fVar35 = (OVar83 + 1.0) * (OVar13 + fVar21);
LAB_0010b873:
    if (profile->step_id != 1) {
      fVar35 = fVar35 + x->step_loss;
    }
    x->step_loss = fVar35;
    if (!isLast) {
      return;
    }
    x->loss = fVar35;
    return;
  case 0x20:
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar21 = 0.0;
    fVar12 = 0.0;
    fVar11 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar13 = ptVar5->tc_val;
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      cVar6 = (char)uVar34;
      OVar83 = OVar13;
      if (cVar6 != '\x0e') {
        OVar83 = fVar12;
      }
      fVar12 = OVar83;
      OVar83 = OVar13;
      if (cVar6 != '\x05') {
        OVar83 = fVar11;
      }
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar25._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar25[3] = uVar18;
      auVar25[2] = uVar18;
      auVar25[1] = cVar6;
      auVar25[0] = cVar6;
      auVar25._8_8_ = 0;
      auVar23 = pshuflw(in_XMM7,auVar25,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\t'),
                       CONCAT12(-(cVar6 == '\t'),CONCAT11(-(cVar6 == '\t'),-(cVar6 == '\t'))));
      auVar85._0_8_ =
           CONCAT17(-(cVar29 == '\v'),
                    CONCAT16(-(cVar29 == '\v'),
                             CONCAT15(-(cVar29 == '\v'),CONCAT14(-(cVar29 == '\v'),uVar7))));
      auVar85[8] = -(cVar30 == '\r');
      auVar85[9] = -(cVar30 == '\r');
      auVar85[10] = -(cVar30 == '\r');
      auVar85[0xb] = -(cVar30 == '\r');
      auVar88[0xc] = -(cVar31 == '\x04');
      auVar88._0_12_ = auVar85;
      auVar88[0xd] = -(cVar31 == '\x04');
      auVar88[0xe] = -(cVar31 == '\x04');
      auVar88[0xf] = -(cVar31 == '\x04');
      auVar75._0_4_ = (uint)OVar13 & uVar7;
      uVar32 = (uint)((ulong)auVar85._0_8_ >> 0x20);
      auVar75._4_4_ = (uint)OVar13 & uVar32;
      auVar75._8_4_ = (uint)OVar13 & auVar85._8_4_;
      auVar75._12_4_ = (uint)OVar13 & auVar88._12_4_;
      auVar89._0_4_ = ~uVar7 & (uint)fVar8;
      auVar89._4_4_ = ~uVar32 & (uint)fVar10;
      auVar89._8_4_ = ~auVar85._8_4_ & (uint)fVar9;
      auVar89._12_4_ = ~auVar88._12_4_ & (uint)fVar21;
      in_XMM7 = auVar89 | auVar75;
      fVar8 = in_XMM7._0_4_;
      fVar10 = in_XMM7._4_4_;
      fVar9 = in_XMM7._8_4_;
      fVar21 = in_XMM7._12_4_;
      fVar11 = OVar83;
    }
    fVar35 = 0.0;
    if (fVar8 <= x->loss) {
      fVar10 = fVar10 * x->loss;
      if (fVar10 <= fVar21) {
        fVar21 = fVar10;
      }
      if (fVar12 * fVar21 <= fVar11) {
        fVar11 = fVar12 * fVar21;
      }
      fVar35 = (fVar9 + 1.0) * (fVar11 + fVar21);
    }
    if (profile->step_id != 1) {
      fVar35 = fVar35 + x->step_loss;
    }
    x->step_loss = fVar35;
    if (!isLast) {
      return;
    }
LAB_0010b9d4:
    x->loss = fVar35;
    return;
  case 0x22:
    fVar8 = 0.0;
    fVar11 = 0.0;
    fVar21 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar13 = ptVar5->tc_val;
      uVar2 = ptVar5->tc_id;
      OVar83 = OVar13;
      if (uVar2 != '\0') {
        OVar83 = fVar8;
      }
      fVar8 = OVar83;
      OVar83 = OVar13;
      if (uVar2 != '\x06') {
        OVar83 = fVar11;
      }
      fVar11 = OVar83;
      if (uVar2 != '\x03') {
        OVar13 = fVar21;
      }
      fVar21 = OVar13;
    }
    fVar10 = x->loss;
    fVar9 = 0.0;
    if (0.0 <= fVar10 - fVar8) {
      fVar9 = fVar10 - fVar8;
    }
    x->effective_deductible = (fVar10 - fVar9) + x->effective_deductible;
    fVar8 = 0.0;
    if (0.0 <= fVar9 - fVar21) {
      fVar8 = fVar9 - fVar21;
    }
    fVar11 = fVar11 * fVar8;
    if (layer < 2) {
      OVar13 = (fVar10 - fVar11) + x->retained_loss;
    }
    else {
      OVar13 = x->previous_layer_retained_loss - fVar11;
    }
    x->retained_loss = OVar13;
    x->loss = fVar11;
    return;
  case 0x25:
    fVar12 = 0.0;
    fVar35 = 0.0;
    fVar82 = 0.0;
    fVar59 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar11 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar50._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar50[3] = uVar18;
      auVar50[2] = uVar18;
      auVar50[0] = (undefined1)uVar34;
      auVar50[1] = auVar50[0];
      auVar50._8_8_ = 0;
      auVar23 = pshuflw(auVar50,auVar50,0);
      uVar33 = CONCAT11(-(auVar23[0] == '\0'),-(auVar23[0] == '\0'));
      uVar34 = CONCAT13(-(auVar23[1] == '\t'),CONCAT12(-(auVar23[1] == '\t'),uVar33));
      uVar36 = CONCAT15(-(auVar23[2] == '\n'),CONCAT14(-(auVar23[2] == '\n'),uVar34));
      uVar37 = CONCAT17(-(auVar23[3] == '\v'),CONCAT16(-(auVar23[3] == '\v'),uVar36));
      auVar40._0_10_ = CONCAT19(-(auVar23[4] == '\r'),CONCAT18(-(auVar23[4] == '\r'),uVar37));
      auVar40[10] = -(auVar23[5] == '\x0e');
      auVar40[0xb] = -(auVar23[5] == '\x0e');
      auVar45[0xc] = -(auVar23[6] == '\x04');
      auVar45._0_12_ = auVar40;
      auVar45[0xd] = -(auVar23[6] == '\x04');
      auVar51[0xe] = -(auVar23[7] == '\x05');
      auVar51._0_14_ = auVar45;
      auVar51[0xf] = -(auVar23[7] == '\x05');
      uVar57 = (undefined2)((ulong)uVar37 >> 0x30);
      auVar69._12_2_ = uVar57;
      auVar69._0_12_ = auVar40;
      auVar69._14_2_ = uVar57;
      uVar57 = (undefined2)((uint6)uVar36 >> 0x20);
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._10_2_ = uVar57;
      auVar68._0_10_ = auVar40._0_10_;
      auVar67._10_6_ = auVar68._10_6_;
      auVar67._8_2_ = uVar57;
      auVar67._0_8_ = uVar37;
      uVar57 = (undefined2)((uint)uVar34 >> 0x10);
      auVar66._8_8_ = auVar67._8_8_;
      auVar66._6_2_ = uVar57;
      auVar66._0_6_ = uVar36;
      auVar65._6_10_ = auVar66._6_10_;
      auVar65._4_2_ = uVar57;
      auVar65._0_4_ = uVar34;
      uVar57 = (undefined2)((unkuint10)auVar40._0_10_ >> 0x40);
      uVar7 = CONCAT22(uVar57,uVar57);
      auVar41._0_8_ = CONCAT26(auVar40._10_2_,CONCAT24(auVar40._10_2_,uVar7));
      auVar41._8_2_ = auVar45._12_2_;
      auVar41._10_2_ = auVar45._12_2_;
      auVar52._14_2_ = auVar51._14_2_;
      auVar52._12_2_ = auVar52._14_2_;
      auVar52._0_12_ = auVar41;
      OVar13 = ptVar5->tc_val;
      uVar32 = (uint)((ulong)auVar41._0_8_ >> 0x20);
      fVar8 = (float)(~uVar7 & (uint)fVar8 | (uint)OVar13 & uVar7);
      fVar10 = (float)(~uVar32 & (uint)fVar10 | (uint)OVar13 & uVar32);
      fVar9 = (float)(~auVar41._8_4_ & (uint)fVar9 | (uint)OVar13 & auVar41._8_4_);
      fVar11 = (float)(~auVar52._12_4_ & (uint)fVar11 | (uint)OVar13 & auVar52._12_4_);
      fVar12 = (float)(~CONCAT22(uVar33,uVar33) & (uint)fVar12 |
                      (uint)OVar13 & CONCAT22(uVar33,uVar33));
      fVar35 = (float)(~auVar65._4_4_ & (uint)fVar35 | (uint)OVar13 & auVar65._4_4_);
      fVar82 = (float)(~auVar67._8_4_ & (uint)fVar82 | (uint)OVar13 & auVar67._8_4_);
      fVar59 = (float)(~auVar68._12_4_ & (uint)fVar59 | (uint)OVar13 & auVar68._12_4_);
    }
    fVar58 = x->loss / x->accumulated_tiv;
    if ((((fVar82 == 1.0) && (!NAN(fVar82))) || (fVar21 = 0.0, fVar58 < fVar82)) &&
       (fVar21 = 0.0, fVar35 <= fVar58)) {
      auVar26._4_4_ = fVar59;
      auVar26._0_4_ = fVar59;
      auVar26._8_4_ = fVar59;
      auVar26._12_4_ = fVar59;
      fVar12 = fVar59 * x->loss - fVar12;
      fVar21 = 0.0;
      if (0.0 <= fVar12) {
        fVar21 = fVar12;
      }
      auVar4._4_8_ = auVar26._8_8_;
      auVar4._0_4_ = fVar10;
      auVar27._0_8_ = auVar4._0_8_ << 0x20;
      auVar27._8_4_ = fVar9;
      auVar27._12_4_ = fVar11;
      auVar28._12_4_ = fVar11;
      auVar28._8_4_ = fVar9;
      auVar28._0_8_ = auVar27._8_8_;
      if (fVar21 <= fVar9) {
        auVar28._0_4_ = fVar21;
      }
      fVar10 = fVar10 * auVar28._0_4_;
      if (fVar10 <= fVar11) {
        fVar11 = fVar10;
      }
      fVar11 = fVar11 + auVar28._0_4_;
      goto LAB_0010b81d;
    }
    break;
  case 0x26:
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar12 = 0.0;
    fVar11 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      OVar13 = ptVar5->tc_val;
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      cVar6 = (char)uVar34;
      OVar83 = OVar13;
      if (cVar6 != '\x05') {
        OVar83 = fVar11;
      }
      fVar11 = OVar83;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar17._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar17[3] = uVar18;
      auVar17[2] = uVar18;
      auVar17[1] = cVar6;
      auVar17[0] = cVar6;
      auVar17._8_8_ = 0;
      auVar23 = pshuflw(in_XMM5,auVar17,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\t'),
                       CONCAT12(-(cVar6 == '\t'),CONCAT11(-(cVar6 == '\t'),-(cVar6 == '\t'))));
      auVar76._0_8_ =
           CONCAT17(-(cVar29 == '\n'),
                    CONCAT16(-(cVar29 == '\n'),
                             CONCAT15(-(cVar29 == '\n'),CONCAT14(-(cVar29 == '\n'),uVar7))));
      auVar76[8] = -(cVar30 == '\r');
      auVar76[9] = -(cVar30 == '\r');
      auVar76[10] = -(cVar30 == '\r');
      auVar76[0xb] = -(cVar30 == '\r');
      auVar79[0xc] = -(cVar31 == '\x0e');
      auVar79._0_12_ = auVar76;
      auVar79[0xd] = -(cVar31 == '\x0e');
      auVar79[0xe] = -(cVar31 == '\x0e');
      auVar79[0xf] = -(cVar31 == '\x0e');
      auVar56._0_4_ = (uint)OVar13 & uVar7;
      uVar32 = (uint)((ulong)auVar76._0_8_ >> 0x20);
      auVar56._4_4_ = (uint)OVar13 & uVar32;
      auVar56._8_4_ = (uint)OVar13 & auVar76._8_4_;
      auVar56._12_4_ = (uint)OVar13 & auVar79._12_4_;
      auVar80._0_4_ = ~uVar7 & (uint)fVar8;
      auVar80._4_4_ = ~uVar32 & (uint)fVar10;
      auVar80._8_4_ = ~auVar76._8_4_ & (uint)fVar9;
      auVar80._12_4_ = ~auVar79._12_4_ & (uint)fVar12;
      in_XMM5 = auVar80 | auVar56;
      fVar8 = in_XMM5._0_4_;
      fVar10 = in_XMM5._4_4_;
      fVar9 = in_XMM5._8_4_;
      fVar12 = in_XMM5._12_4_;
    }
    fVar35 = x->loss / x->accumulated_tiv;
    if ((((fVar10 == 1.0) && (!NAN(fVar10))) || (fVar21 = 0.0, fVar35 < fVar10)) &&
       (fVar21 = 0.0, fVar8 <= fVar35)) {
      fVar12 = fVar12 * x->step_loss;
      if (fVar12 <= fVar11) {
        fVar11 = fVar12;
      }
      fVar21 = fVar9 * (x->step_loss + fVar11) + fVar11;
    }
    break;
  default:
    if (uVar7 == 100) {
      return;
    }
    if (uVar7 != 2) goto switchD_0010af93_caseD_d;
    fVar11 = 0.0;
    fVar21 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    for (ptVar5 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar5 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
      uVar34 = *(undefined4 *)&ptVar5->tc_id;
      uVar20 = (undefined1)((uint)uVar34 >> 0x18);
      uVar19 = (undefined1)((uint)uVar34 >> 0x10);
      uVar18 = (undefined1)((uint)uVar34 >> 8);
      auVar23._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar34)) >> 0x20)
      ;
      auVar23[3] = uVar18;
      auVar23[2] = uVar18;
      auVar23[0] = (undefined1)uVar34;
      auVar23[1] = auVar23[0];
      auVar23._8_8_ = 0;
      auVar23 = pshuflw(auVar23,auVar23,0);
      cVar31 = auVar23[3];
      cVar30 = auVar23[2];
      cVar29 = auVar23[1];
      cVar6 = auVar23[0];
      uVar7 = CONCAT13(-(cVar6 == '\x06'),
                       CONCAT12(-(cVar6 == '\x06'),CONCAT11(-(cVar6 == '\x06'),-(cVar6 == '\x06'))))
      ;
      auVar22._0_8_ =
           CONCAT17(-(cVar29 == '\0'),
                    CONCAT16(-(cVar29 == '\0'),
                             CONCAT15(-(cVar29 == '\0'),CONCAT14(-(cVar29 == '\0'),uVar7))));
      auVar22[8] = -(cVar30 == '\x03');
      auVar22[9] = -(cVar30 == '\x03');
      auVar22[10] = -(cVar30 == '\x03');
      auVar22[0xb] = -(cVar30 == '\x03');
      auVar24[0xc] = -(cVar31 == '\x04');
      auVar24._0_12_ = auVar22;
      auVar24[0xd] = -(cVar31 == '\x04');
      auVar24[0xe] = -(cVar31 == '\x04');
      auVar24[0xf] = -(cVar31 == '\x04');
      OVar13 = ptVar5->tc_val;
      uVar32 = (uint)((ulong)auVar22._0_8_ >> 0x20);
      fVar11 = (float)(~uVar7 & (uint)fVar11 | (uint)OVar13 & uVar7);
      fVar21 = (float)(~uVar32 & (uint)fVar21 | (uint)OVar13 & uVar32);
      fVar8 = (float)(~auVar22._8_4_ & (uint)fVar8 | (uint)OVar13 & auVar22._8_4_);
      fVar10 = (float)(~auVar24._12_4_ & (uint)fVar10 | (uint)OVar13 & auVar24._12_4_);
    }
    fVar9 = x->loss;
    fVar12 = 0.0;
    if (0.0 <= fVar9 - fVar21) {
      fVar12 = fVar9 - fVar21;
    }
    x->effective_deductible = (fVar9 - fVar12) + x->effective_deductible;
    uVar7 = -(uint)(fVar8 + fVar10 < fVar12);
    fVar8 = (float)(~uVar7 & (uint)(fVar12 - fVar8) | (uint)fVar10 & uVar7);
    fVar21 = 0.0;
    if (0.0 <= fVar8) {
      fVar21 = fVar8;
    }
    fVar21 = fVar21 * fVar11;
    if (layer < 2) goto LAB_0010b723;
LAB_0010b361:
    OVar13 = x->previous_layer_retained_loss - fVar21;
LAB_0010b72c:
    x->retained_loss = OVar13;
    goto LAB_0010b99a;
  }
  if (profile->step_id != 1) {
    fVar21 = fVar21 + x->step_loss;
  }
  x->step_loss = fVar21;
  if (!isLast) {
    return;
  }
LAB_0010b99a:
  x->loss = fVar21;
  return;
}

Assistant:

void applycalcrule_stepped(const profile_rec_new& profile, LossRec& x, int layer,bool isLast)
{
	switch (profile.calcrule_id) {
	case 2:
	{
		OASIS_FLOAT ded = 0;
		OASIS_FLOAT lim = 0;
		OASIS_FLOAT share = 0;
		OASIS_FLOAT att = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) ded = y.tc_val;
			if (y.tc_id == limit_1) lim = y.tc_val;
			if (y.tc_id == share_1) share = y.tc_val;
			if (y.tc_id == attachment_1) att = y.tc_val;
		}
		//Function2: deductible applies before attachment limit share
		//IIf(Loss < Ded, 0, Loss - Ded)
		//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
		OASIS_FLOAT loss = 0;
		loss = x.loss - ded;
		if (loss < 0) loss = 0;
		x.effective_deductible = x.effective_deductible + (x.loss - loss);
		if (loss > (att + lim)) loss = lim;
		else loss = loss - att;
		if (loss < 0) loss = 0;
		loss = loss * share;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;

		x.loss = loss;
	}
	break;
	case 12:
	{
		if (x.loss > 0) {
			for (auto& z : profile.tc_vec) {
				if (z.tc_id == deductible_1) {
					OASIS_FLOAT loss = x.loss - z.tc_val;
					if (loss < 0) loss = 0;
					x.effective_deductible = x.effective_deductible + (x.loss - loss);
					if (x.effective_deductible > x.under_limit) x.under_limit = x.effective_deductible;
					x.retained_loss = x.retained_loss + (x.loss - loss);
					x.loss = loss;
					break;
				}
			}
		}
	}
	break;
	case 14:
	{
		OASIS_FLOAT lim = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == limit_1) lim = y.tc_val;
		}
		//Function14 =  IIf(Loss > lim, Lim, Loss)
		OASIS_FLOAT loss = x.loss;
			if (loss > lim) {
				x.over_limit = loss - lim;
				loss = lim;
			}
		OASIS_FLOAT under_limit = 0;
		under_limit = x.under_limit;
		if (x.effective_deductible > under_limit) under_limit = x.effective_deductible;
		if (lim - loss < under_limit) under_limit = lim - loss;
		x.under_limit = under_limit;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;
		x.loss = loss;
	}
	break;
	case 27:
	{
		OASIS_FLOAT deductible1 = 0;
		OASIS_FLOAT tstart = 0;
		OASIS_FLOAT tend = 0;
		OASIS_FLOAT payout = 0;
		OASIS_FLOAT scale1 = 0;
		OASIS_FLOAT scale2 = 0;
		OASIS_FLOAT limit1 = 0;
		OASIS_FLOAT limit2 = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) deductible1 = y.tc_val;
			if (y.tc_id == trigger_start) tstart = y.tc_val;
			if (y.tc_id == trigger_end) tend = y.tc_val;
			if (y.tc_id == payout_start) payout = y.tc_val;
			if (y.tc_id == scale_1) scale1 = y.tc_val;
			if (y.tc_id == scale_2) scale2 = y.tc_val;
			if (y.tc_id == limit_1) limit1 = y.tc_val;
			if (y.tc_id == limit_2) limit2 = y.tc_val;

		}
		// Step policy: single step with % loss tiv payout and limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
		OASIS_FLOAT loss = 0;
		OASIS_FLOAT condloss = 0;
		loss = x.loss / x.accumulated_tiv;
		if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
			if (loss >= tstart) {
				loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
				if (loss < 0) loss = 0;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1); // gross up for debris removal
			}
				else loss = 0;
		}
		else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
			if (loss < tend) {
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else loss = 0;
		}

		if (profile.step_id == 1) {
			x.step_loss = loss;
		}
		else {
			x.step_loss = x.step_loss + loss;
		}
		if (isLast == true) {
			x.loss = x.step_loss;
		}
	}
	break;
		case 28:
		{		
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			

			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;				
			}
			// Step policy: single (final) step with % loss payout, no limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 29:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % loss tiv payout, no limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 30:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % limit payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * limit1) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * limit1) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 31:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with monetary amount payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = payout - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = payout - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 32:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;

			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: franchise trigger as a monetary amount with % loss payout, a limit amount and optional extra expenses and scale up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			if (x.loss >= tstart) {
				loss = payout * x.loss;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1);
			}
			else loss = 0;
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}


		}
		break;
		case 34:
		{
			OASIS_FLOAT ded = 0;
			OASIS_FLOAT share = 0;
			OASIS_FLOAT att = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) ded = y.tc_val;
				if (y.tc_id == share_1) share = y.tc_val;
				if (y.tc_id == attachment_1) att = y.tc_val;
			}
			//Function2: deductible applies before attachment limit share
			//IIf(Loss < Ded, 0, Loss - Ded)
			//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
			OASIS_FLOAT loss = 0;
			loss = x.loss - ded;
			if (loss < 0) loss = 0;
			x.effective_deductible = x.effective_deductible + (x.loss - loss);
			loss = loss - att;
			if (loss < 0) loss = 0;
			loss = loss * share;
			//x.retained_loss = x.retained_loss + (x.loss - loss);
			OASIS_FLOAT net_loss = 0;
			if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
			else net_loss = x.retained_loss + (x.loss - loss);
			x.retained_loss = net_loss;
			x.loss = loss;
		}
		break;
		case 37:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: single (final) step with % loss payout and limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						if (loss > limit1) loss = limit1;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 38:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: conditional payouts only, triggered by loss % TIV.  Extra expense payout with limit amount, and a gross up factor for debris removal, with payout based on prior step payout
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT trigger = 0;
			OASIS_FLOAT condloss = 0;
			OASIS_FLOAT debrisloss = 0;
			trigger = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (trigger >= tstart) {
					condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
					loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (trigger < tend) {
					if (trigger >= tstart) {
						condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
						loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 100:	// noop
		{
			x.loss = x.loss;
		}
		break;
		default:
		{
			fprintf(stderr, "FATAL: Unknown calc rule %d\n", profile.calcrule_id);
		}
	}
}